

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O1

void __thiscall DepfileParserTestEscapedColons::Run(DepfileParserTestEscapedColons *this)

{
  pointer pSVar1;
  size_t sVar2;
  char *pcVar3;
  Test *pTVar4;
  bool bVar5;
  int iVar6;
  string err;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  string local_48;
  
  pTVar4 = g_current_test;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  bVar5 = DepfileParserTest::Parse
                    (&this->super_DepfileParserTest,
                     "c\\:\\gcc\\x86_64-w64-mingw32\\include\\stddef.o: \\\n c:\\gcc\\x86_64-w64-mingw32\\include\\stddef.h \n"
                     ,&local_48);
  testing::Test::Check
            (pTVar4,bVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
             ,0x9b,
             "Parse( \"c\\\\:\\\\gcc\\\\x86_64-w64-mingw32\\\\include\\\\stddef.o: \\\\\\n\" \" c:\\\\gcc\\\\x86_64-w64-mingw32\\\\include\\\\stddef.h \\n\", &err)"
            );
  pTVar4 = g_current_test;
  iVar6 = std::__cxx11::string::compare((char *)&local_48);
  bVar5 = testing::Test::Check
                    (pTVar4,iVar6 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                     ,0x9c,"\"\" == err");
  if (bVar5) {
    bVar5 = testing::Test::Check
                      (g_current_test,
                       (long)(this->super_DepfileParserTest).parser_.outs_.
                             super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->super_DepfileParserTest).parser_.outs_.
                             super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                             super__Vector_impl_data._M_start == 0x10,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                       ,0x9d,"1u == parser_.outs_.size()");
    pTVar4 = g_current_test;
    if (bVar5) {
      pSVar1 = (this->super_DepfileParserTest).parser_.outs_.
               super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar2 = pSVar1->len_;
      if (sVar2 == 0) {
        local_68 = &local_58;
        local_60 = 0;
        local_58 = 0;
      }
      else {
        pcVar3 = pSVar1->str_;
        local_68 = &local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar3,pcVar3 + sVar2);
      }
      iVar6 = std::__cxx11::string::compare((char *)&local_68);
      testing::Test::Check
                (pTVar4,iVar6 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                 ,0x9f,
                 "\"c:\\\\gcc\\\\x86_64-w64-mingw32\\\\include\\\\stddef.o\" == parser_.outs_[0].AsString()"
                );
      if (local_68 != &local_58) {
        operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
      }
      bVar5 = testing::Test::Check
                        (g_current_test,
                         (long)(this->super_DepfileParserTest).parser_.ins_.
                               super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                         (long)(this->super_DepfileParserTest).parser_.ins_.
                               super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl
                               .super__Vector_impl_data._M_start == 0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                         ,0xa0,"1u == parser_.ins_.size()");
      pTVar4 = g_current_test;
      if (bVar5) {
        pSVar1 = (this->super_DepfileParserTest).parser_.ins_.
                 super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar2 = pSVar1->len_;
        local_68 = &local_58;
        if (sVar2 == 0) {
          local_60 = 0;
          local_58 = 0;
        }
        else {
          pcVar3 = pSVar1->str_;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar3,pcVar3 + sVar2)
          ;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_68);
        testing::Test::Check
                  (pTVar4,iVar6 == 0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/depfile_parser_test.cc"
                   ,0xa2,
                   "\"c:\\\\gcc\\\\x86_64-w64-mingw32\\\\include\\\\stddef.h\" == parser_.ins_[0].AsString()"
                  );
        if (local_68 != &local_58) {
          operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
        }
        goto LAB_0014c392;
      }
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
LAB_0014c392:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(DepfileParserTest, EscapedColons)
{
  std::string err;
  // Tests for correct parsing of depfiles produced on Windows
  // by both Clang, GCC pre 10 and GCC 10
  EXPECT_TRUE(Parse(
"c\\:\\gcc\\x86_64-w64-mingw32\\include\\stddef.o: \\\n"
" c:\\gcc\\x86_64-w64-mingw32\\include\\stddef.h \n",
      &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, parser_.outs_.size());
  EXPECT_EQ("c:\\gcc\\x86_64-w64-mingw32\\include\\stddef.o",
            parser_.outs_[0].AsString());
  ASSERT_EQ(1u, parser_.ins_.size());
  EXPECT_EQ("c:\\gcc\\x86_64-w64-mingw32\\include\\stddef.h",
            parser_.ins_[0].AsString());
}